

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O2

void __thiscall
Statsd::StatsdClient::send<double>
          (StatsdClient *this,string *key,double value,char *type,float frequency,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  string *psVar1;
  pointer pbVar2;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  char cVar3;
  int in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  pointer pbVar4;
  long *in_FS_OFFSET;
  result_type_conflict1 rVar5;
  float fVar6;
  float fVar7;
  string local_1d8;
  stringstream valueStream;
  long local_1a8;
  size_t local_1a0 [2];
  uint auStack_190 [88];
  
  if (((this->m_sender)._M_t.
       super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>._M_t.
       super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>.
       super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl)->m_socket != -1) {
    fVar6 = 1.0;
    if (frequency <= 1.0) {
      fVar6 = frequency;
    }
    if ((0.0 <= fVar6) && (1.0 < frequency || 0.0001 <= ABS(frequency))) {
      fVar7 = 0.0;
      if (0.0 <= fVar6) {
        fVar7 = fVar6;
      }
      if (0.0001 <= ABS(fVar7 + -1.0)) {
        _valueStream = 0x3f80000000000000;
        rVar5 = std::uniform_real_distribution<float>::operator()
                          ((uniform_real_distribution<float> *)&valueStream,&this->m_randomEngine);
        if (fVar7 < rVar5) {
          return;
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&valueStream);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
      __n = (size_t)this->m_gaugePrecision;
      *(size_t *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = __n;
      std::ostream::_M_insert<double>(value);
      if ((char)in_FS_OFFSET[-1] == '\0') {
        __n = *in_FS_OFFSET - 0x18;
        in_FS_OFFSET[-5] = __n;
        in_FS_OFFSET[-4] = 0;
        *(undefined1 *)(in_FS_OFFSET + -3) = 0;
        __cxa_thread_atexit(std::__cxx11::string::~string,*in_FS_OFFSET + -0x28,&__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      in_FS_OFFSET[-4] = 0;
      psVar1 = (string *)(*in_FS_OFFSET + -0x28);
      *(undefined1 *)in_FS_OFFSET[-5] = 0;
      std::__cxx11::string::reserve((ulong)psVar1);
      std::__cxx11::string::append(psVar1);
      cVar3 = (char)psVar1;
      if (((this->m_prefix)._M_string_length != 0) && (key->_M_string_length != 0)) {
        std::__cxx11::string::push_back(cVar3);
      }
      std::__cxx11::string::append(psVar1);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append(psVar1);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::append((char *)psVar1);
      __buf = extraout_RDX;
      if (fVar7 < 1.0) {
        std::__cxx11::string::append((char *)psVar1);
        std::__cxx11::to_string(&local_1d8,(int)(fVar7 * 100.0));
        std::__cxx11::string::append(psVar1);
        std::__cxx11::string::~string((string *)&local_1d8);
        __buf = extraout_RDX_00;
      }
      if ((tags->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (tags->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::append((char *)psVar1);
        pbVar2 = (tags->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar4 = (tags->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2;
            pbVar4 = pbVar4 + 1) {
          std::__cxx11::string::append(psVar1);
          std::__cxx11::string::push_back(cVar3);
        }
        std::__cxx11::string::pop_back();
        __buf = extraout_RDX_01;
      }
      UDPSender::send((this->m_sender)._M_t.
                      super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>
                      .super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl,(int)psVar1,
                      __buf,__n,in_R8D);
      std::__cxx11::stringstream::~stringstream((stringstream *)&valueStream);
    }
  }
  return;
}

Assistant:

inline void StatsdClient::send(const std::string& key,
                               const T value,
                               const char* type,
                               float frequency,
                               const std::vector<std::string>& tags) const noexcept {
    // Bail if we can't send anything anyway
    if (!m_sender->initialized()) {
        return;
    }

    // A valid frequency is: 0 <= f <= 1
    // At 0 you never emit the stat, at 1 you always emit the stat and with anything else you roll the dice
    frequency = std::max(std::min(frequency, 1.f), 0.f);
    constexpr float epsilon{0.0001f};
    const bool isFrequencyOne = std::fabs(frequency - 1.0f) < epsilon;
    const bool isFrequencyZero = std::fabs(frequency) < epsilon;
    if (isFrequencyZero ||
        (!isFrequencyOne && (frequency < std::uniform_real_distribution<float>(0.f, 1.f)(m_randomEngine)))) {
        return;
    }

    // Format the stat message
    std::stringstream valueStream;
    valueStream << std::fixed << std::setprecision(m_gaugePrecision) << value;

    // the thread keeps this buffer around and reuses it, clear should be O(1)
    // and reserve should only have to do so the first time, after that, it's a no-op
    static thread_local std::string buffer;
    buffer.clear();
    buffer.reserve(256);

    buffer.append(m_prefix);
    if (!m_prefix.empty() && !key.empty()) {
        buffer.push_back('.');
    }

    buffer.append(key);
    buffer.push_back(':');
    buffer.append(valueStream.str());
    buffer.push_back('|');
    buffer.append(type);

    if (frequency < 1.f) {
        buffer.append("|@0.");
        buffer.append(std::to_string(static_cast<int>(frequency * 100)));
    }

    if (!tags.empty()) {
        buffer.append("|#");
        for (const auto& tag : tags) {
            buffer.append(tag);
            buffer.push_back(',');
        }
        buffer.pop_back();
    }

    // Send the message via the UDP sender
    m_sender->send(buffer);
}